

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

optional<bidfx_public_api::price::pixie::SubscriptionSync> * __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync
          (optional<bidfx_public_api::price::pixie::SubscriptionSync> *__return_storage_ptr__,
          SubjectSetRegister *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  element_type *this_00;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *__y;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_bool>
  pVar4;
  bool local_199;
  _Rb_tree_color local_17c;
  undefined1 local_160 [8];
  SubscriptionSync result;
  undefined1 local_e8 [24];
  SubscriptionSync subscription_sync;
  _Self local_68;
  iterator edition_data;
  _Rb_tree_color local_58 [2];
  int edition;
  undefined1 local_48 [8];
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subject_set;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  SubjectSetRegister *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  if ((this->modified_ & 1U) == 0) {
    std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::optional
              (__return_storage_ptr__);
    subject_set.
    super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    this->modified_ = false;
    CurrentSubjectSetSorted
              ((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)local_48,this);
    bVar1 = std::
            map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
            ::empty(&this->subject_set_cache_);
    if (bVar1) {
      local_17c = _S_red;
    }
    else {
      std::
      map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
      ::rbegin((map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
                *)&edition_data);
      ppVar2 = std::
               reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
               ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
                             *)&edition_data);
      local_17c = ppVar2->first;
    }
    local_58[0] = local_17c;
    local_68._M_node =
         (_Base_ptr)
         std::
         map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
         ::find(&this->subject_set_cache_,(key_type *)local_58);
    subscription_sync.subjects_.
    super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
                  ::end(&this->subject_set_cache_);
    bVar1 = std::operator!=(&local_68,
                            (_Self *)&subscription_sync.subjects_.
                                      super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_199 = false;
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>
               ::operator->(&local_68);
      this_00 = std::
                __shared_ptr_access<bidfx_public_api::price::pixie::EditionData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<bidfx_public_api::price::pixie::EditionData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar3->second);
      __y = EditionData::GetSubjects(this_00);
      local_199 = std::operator==((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                                   *)local_48,__y);
    }
    if (local_199 == false) {
      local_58[0] = local_58[0] + _S_black;
      std::
      make_shared<bidfx_public_api::price::pixie::EditionData,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>&>
                ((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  *)local_e8);
      pVar4 = std::
              map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
              ::insert_or_assign<std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>
                        ((map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
                          *)&this->subject_set_cache_,(key_type *)local_58,
                         (shared_ptr<bidfx_public_api::price::pixie::EditionData> *)local_e8);
      result.subjects_.
      super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar4.first._M_node;
      std::shared_ptr<bidfx_public_api::price::pixie::EditionData>::~shared_ptr
                ((shared_ptr<bidfx_public_api::price::pixie::EditionData> *)local_e8);
      CreateSubscriptionSync
                ((SubscriptionSync *)local_160,this,local_58[0],
                 (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  *)local_48);
      CleanUnsubscribeState(this);
      std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::
      optional<bidfx_public_api::price::pixie::SubscriptionSync,_true>
                (__return_storage_ptr__,(SubscriptionSync *)local_160);
      subject_set.
      super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      SubscriptionSync::~SubscriptionSync((SubscriptionSync *)local_160);
    }
    else {
      CreateSubscriptionSync
                ((SubscriptionSync *)(local_e8 + 0x10),this,local_58[0],
                 (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  *)local_48);
      bVar1 = SubscriptionSync::HasControls((SubscriptionSync *)(local_e8 + 0x10));
      if (bVar1) {
        SubscriptionSync::SetChangedEdition((SubscriptionSync *)(local_e8 + 0x10),false);
        std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::
        optional<bidfx_public_api::price::pixie::SubscriptionSync,_true>
                  (__return_storage_ptr__,(SubscriptionSync *)(local_e8 + 0x10));
      }
      else {
        std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::optional
                  (__return_storage_ptr__);
      }
      subject_set.
      super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      SubscriptionSync::~SubscriptionSync((SubscriptionSync *)(local_e8 + 0x10));
    }
    std::
    vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
    ::~vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
               *)local_48);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::optional<SubscriptionSync> SubjectSetRegister::NextSubscriptionSync()
{
    std::unique_lock<std::mutex> lck(mutex_);
    if (!modified_) { return {}; }
    modified_ = false;

    std::vector<Subject> subject_set = CurrentSubjectSetSorted();
    int edition = subject_set_cache_.empty() ? 0 : subject_set_cache_.rbegin()->first;
    auto edition_data = subject_set_cache_.find(edition);

    if (edition_data != subject_set_cache_.end() && subject_set == edition_data->second->GetSubjects())
    {
        SubscriptionSync subscription_sync = CreateSubscriptionSync(edition, subject_set);
        if (!subscription_sync.HasControls())
        {
            return {};
        }
        subscription_sync.SetChangedEdition(false);
        return std::move(subscription_sync);
    }

    subject_set_cache_.insert_or_assign(++edition, std::make_shared<EditionData>(subject_set));
    SubscriptionSync result = CreateSubscriptionSync(edition, subject_set);
    CleanUnsubscribeState();
    return std::move(result);
}